

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O1

int mbedtls_cipher_cmac(mbedtls_cipher_info_t *cipher_info,uchar *key,size_t keylen,uchar *input,
                       size_t ilen,uchar *output)

{
  int iVar1;
  mbedtls_cipher_context_t ctx;
  mbedtls_cipher_context_t local_90;
  
  iVar1 = -0x6100;
  if ((output != (uchar *)0x0 && input != (uchar *)0x0) &&
      (key != (uchar *)0x0 && cipher_info != (mbedtls_cipher_info_t *)0x0)) {
    mbedtls_cipher_init(&local_90);
    iVar1 = mbedtls_cipher_setup(&local_90,cipher_info);
    if (iVar1 == 0) {
      iVar1 = mbedtls_cipher_cmac_starts(&local_90,key,keylen);
      if (iVar1 == 0) {
        iVar1 = mbedtls_cipher_cmac_update(&local_90,input,ilen);
        if (iVar1 == 0) {
          iVar1 = mbedtls_cipher_cmac_finish(&local_90,output);
        }
      }
    }
    mbedtls_cipher_free(&local_90);
  }
  return iVar1;
}

Assistant:

int mbedtls_cipher_cmac( const mbedtls_cipher_info_t *cipher_info,
                         const unsigned char *key, size_t keylen,
                         const unsigned char *input, size_t ilen,
                         unsigned char *output )
{
    mbedtls_cipher_context_t ctx;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if( cipher_info == NULL || key == NULL || input == NULL || output == NULL )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    mbedtls_cipher_init( &ctx );

    if( ( ret = mbedtls_cipher_setup( &ctx, cipher_info ) ) != 0 )
        goto exit;

    ret = mbedtls_cipher_cmac_starts( &ctx, key, keylen );
    if( ret != 0 )
        goto exit;

    ret = mbedtls_cipher_cmac_update( &ctx, input, ilen );
    if( ret != 0 )
        goto exit;

    ret = mbedtls_cipher_cmac_finish( &ctx, output );

exit:
    mbedtls_cipher_free( &ctx );

    return( ret );
}